

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_NtkCollectCopies(Acb_Ntk_t *p,Gia_Man_t *pGia,Vec_Ptr_t **pvNodesR)

{
  int iVar1;
  uint i;
  uint uVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *p_02;
  void **__s;
  Gia_Obj_t *pGVar4;
  void *pvVar5;
  char *pcVar6;
  int iVar7;
  int i_00;
  ulong uVar8;
  
  p_00 = Acb_NtkFindNodes2(p);
  p_01 = Vec_IntAlloc((p->vObjType).nSize + -1);
  iVar1 = pGia->nObjs;
  p_02 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  p_02->nCap = iVar7;
  i_00 = 0;
  if (iVar7 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar7 << 3);
  }
  p_02->pArray = __s;
  p_02->nSize = iVar1;
  uVar8 = 0;
  memset(__s,0,(long)iVar1 << 3);
  iVar7 = p_00->nSize;
  do {
    iVar3 = (int)uVar8;
    if (iVar7 <= i_00) {
      Vec_IntFree(p_00);
      Vec_IntSort(p_01,iVar3);
      *pvNodesR = p_02;
      return p_01;
    }
    i = Vec_IntEntry(p_00,i_00);
    uVar8 = (ulong)i;
    uVar2 = Acb_ObjCopy(p,i);
    if (-1 < (int)uVar2) {
      uVar2 = uVar2 >> 1;
      uVar8 = (ulong)uVar2;
      pGVar4 = Gia_ManObj(pGia,uVar2);
      if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
        uVar8 = (ulong)uVar2;
        pvVar5 = Vec_PtrEntry(p_02,uVar2);
        if (pvVar5 == (void *)0x0) {
          if ((int)i < 1) {
            __assert_fail("i>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                          ,0x10e,"char *Acb_ObjNameStr(Acb_Ntk_t *, int)");
          }
          iVar3 = Acb_ObjName(p,i);
          pcVar6 = Acb_NtkStr(p,iVar3);
          pcVar6 = Abc_UtilStrsav(pcVar6);
          if (iVar1 <= (int)uVar2) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          __s[uVar2] = pcVar6;
          uVar8 = (ulong)uVar2;
          Vec_IntPush(p_01,uVar2);
        }
      }
    }
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkCollectCopies( Acb_Ntk_t * p, Gia_Man_t * pGia, Vec_Ptr_t ** pvNodesR )
{
    int i, iObj, iLit;
    Vec_Int_t * vObjs   = Acb_NtkFindNodes2( p );
    Vec_Int_t * vNodes  = Vec_IntAlloc( Acb_NtkObjNum(p) );
    Vec_Ptr_t * vNodesR = Vec_PtrStart( Gia_ManObjNum(pGia) );
    Vec_IntForEachEntry( vObjs, iObj, i )
        if ( (iLit = Acb_ObjCopy(p, iObj)) >= 0 && Gia_ObjIsAnd(Gia_ManObj(pGia, Abc_Lit2Var(iLit))) )
        {
            if ( Vec_PtrEntry(vNodesR, Abc_Lit2Var(iLit)) == NULL )
            {
                Vec_PtrWriteEntry( vNodesR, Abc_Lit2Var(iLit), Abc_UtilStrsav(Acb_ObjNameStr(p, iObj)) );
                Vec_IntPush( vNodes, Abc_Lit2Var(iLit) );
            }
        }
    Vec_IntFree( vObjs );
    Vec_IntSort( vNodes, 0 );
    *pvNodesR = vNodesR;
    return vNodes;
}